

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

int __thiscall
CTcTokenizer::parse_macro_actuals
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcHashEntryPp *entry,
          size_t *argofs,size_t *arglen,int read_more,int *found_actuals)

{
  tok_embed_ctx *ec;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  tc_toktyp_t tVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  byte *p;
  ulong uVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  bool bVar15;
  CTcToken tok;
  CTcToken local_58;
  
  ec = &this->macro_in_embedding_;
  bVar2 = true;
  tVar4 = next_on_line(srcbuf,src,&local_58,ec,1);
  if (read_more == 0 || tVar4 != TOKT_EOF) {
    bVar2 = false;
    if (tVar4 != TOKT_LPAR) {
      *found_actuals = 0;
      return 0;
    }
  }
  else {
    tVar4 = actual_splice_next_line(this,srcbuf,src,&local_58);
    if (tVar4 != TOKT_LPAR) {
      *found_actuals = 0;
      unsplice_line(this,local_58.text_);
      return 0;
    }
  }
  *argofs = (size_t)(local_58.text_ + (local_58.text_len_ - (long)srcbuf->buf_));
  tVar4 = next_on_line(srcbuf,src,&local_58,ec,1);
  uVar14 = 0;
  if (tVar4 != TOKT_RPAR) {
    uVar14 = 0;
    do {
      if ((((long)entry->argc_ <= (long)uVar14) && ((entry->field_0x44 & 2) == 0)) ||
         (0x7f < uVar14)) {
        log_error(0x2731,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                  (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
        goto LAB_00251cb3;
      }
      iVar11 = 0;
      iVar7 = 0;
      iVar10 = 0;
      while( true ) {
        pcVar3 = local_58.text_;
        bVar15 = iVar11 == 0;
        if (((iVar7 == 0 && iVar10 == 0) && (tVar4 == TOKT_COMMA && bVar15)) ||
           (tVar4 == TOKT_RPAR && bVar15)) break;
        switch(tVar4) {
        case TOKT_LPAR:
          iVar11 = iVar11 + 1;
          break;
        case TOKT_RPAR:
          iVar11 = iVar11 + -1;
          break;
        case TOKT_LBRACE:
          iVar10 = iVar10 + 1;
          break;
        case TOKT_RBRACE:
          iVar10 = iVar10 + -1;
          break;
        case TOKT_LBRACK:
          iVar7 = iVar7 + 1;
          break;
        case TOKT_RBRACK:
          iVar7 = iVar7 + -1;
        }
        tVar4 = next_on_line(srcbuf,src,&local_58,ec,1);
        if (tVar4 == TOKT_EOF && read_more != 0) {
          tVar4 = actual_splice_next_line(this,srcbuf,src,&local_58);
          bVar2 = true;
        }
        if (tVar4 == TOKT_EOF) goto LAB_00251ce0;
      }
      pbVar12 = (byte *)local_58.text_;
      if (srcbuf->buf_ + argofs[uVar14] < local_58.text_) {
        iVar11 = 0;
        do {
          bVar1 = pbVar12[-1 - (ulong)(~(uint)(pbVar12[-1] >> 6) & (uint)(pbVar12[-1] >> 7))];
          pbVar12 = pbVar12 + (-1 - (ulong)(~(uint)(pbVar12[-1] >> 6) & (uint)(pbVar12[-1] >> 7))) +
                    -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7));
          wVar5 = utf8_ptr::s_getch((char *)pbVar12);
          if ((0x7f < (uint)wVar5) || (iVar6 = isspace(wVar5), iVar6 == 0)) {
            pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3)
                                + 1;
            if (iVar11 != 0 && wVar5 == L'\\') {
              pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3
                                         ) + 1;
            }
            break;
          }
          iVar11 = iVar11 + -1;
        } while (srcbuf->buf_ + argofs[uVar14] < pbVar12);
      }
      arglen[uVar14] = (long)pbVar12 - (long)(srcbuf->buf_ + argofs[uVar14]);
      uVar14 = uVar14 + 1;
      if ((iVar7 != 0 || iVar10 != 0) || (tVar4 != TOKT_COMMA || !bVar15)) break;
      argofs[uVar14] = (size_t)(pcVar3 + (local_58.text_len_ - (long)srcbuf->buf_));
      tVar4 = next_on_line(srcbuf,src,&local_58,ec,1);
    } while (tVar4 != TOKT_RPAR);
LAB_00251d2f:
    if (0 < (int)(uint)uVar14) {
      uVar9 = 0;
      do {
        sVar8 = argofs[uVar9];
        pbVar13 = (byte *)(srcbuf->buf_ + sVar8);
        pbVar12 = pbVar13 + arglen[uVar9];
        p = pbVar13;
        if (0 < (long)arglen[uVar9]) {
          do {
            wVar5 = utf8_ptr::s_getch((char *)p);
            if ((0x7f < (uint)wVar5) || (iVar7 = isspace(wVar5), iVar7 == 0)) break;
            p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
          } while (p < pbVar12);
          sVar8 = argofs[uVar9];
        }
        argofs[uVar9] = sVar8 + ((long)p - (long)pbVar13);
        arglen[uVar9] = arglen[uVar9] - ((long)p - (long)pbVar13);
        pbVar13 = pbVar12;
        if (p < pbVar12) {
          iVar7 = 0;
          do {
            bVar1 = pbVar13[-1 - (ulong)(~(uint)(pbVar13[-1] >> 6) & (uint)(pbVar13[-1] >> 7))];
            pbVar13 = pbVar13 + (-1 - (ulong)(~(uint)(pbVar13[-1] >> 6) & (uint)(pbVar13[-1] >> 7)))
                      + -(ulong)(~(uint)(bVar1 >> 6) & (uint)(bVar1 >> 7));
            wVar5 = utf8_ptr::s_getch((char *)pbVar13);
            if ((0x7f < (uint)wVar5) || (iVar11 = isspace(wVar5), iVar11 == 0)) {
              pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3
                                         ) + 1;
              if (iVar7 != 0 && wVar5 == L'\\') {
                pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar13 >> 7) * 3) + 1;
              }
              break;
            }
            iVar7 = iVar7 + -1;
          } while (p < pbVar13);
        }
        arglen[uVar9] = (size_t)(pbVar13 + (arglen[uVar9] - (long)pbVar12));
        uVar9 = uVar9 + 1;
      } while (uVar9 != ((uint)uVar14 & 0x7fffffff));
    }
  }
  iVar7 = (int)uVar14;
  if (bVar2) {
    unsplice_line(this,local_58.text_ + local_58.text_len_);
  }
  bVar1 = entry->field_0x44;
  if (iVar7 < (int)((char)(bVar1 << 6) >> 7) + entry->argc_) {
    if (iVar7 < entry->argc_) {
      uVar14 = (ulong)iVar7;
      do {
        argofs[uVar14] = 0;
        arglen[uVar14] = 0;
        uVar14 = uVar14 + 1;
      } while ((long)uVar14 < (long)entry->argc_);
    }
    iVar7 = (int)uVar14;
    log_warning(0x272f,(ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
                (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
    bVar1 = entry->field_0x44;
  }
  if (((bVar1 & 2) != 0) && (iVar7 < 0x80)) {
    argofs[iVar7] = 0;
    arglen[iVar7] = 0;
  }
  *found_actuals = 1;
  return 0;
LAB_00251cb3:
  if (tVar4 == TOKT_EOF) {
LAB_00251ce0:
    log_error((uint)(read_more != 0) * 3 + 0x272d,
              (ulong)(uint)(entry->super_CVmHashEntryCS).super_CVmHashEntry.len_,
              (entry->super_CVmHashEntryCS).super_CVmHashEntry.str_);
    return 1;
  }
  if (tVar4 == TOKT_RPAR) goto LAB_00251d2f;
  tVar4 = next_on_line(srcbuf,src,&local_58,ec,1);
  goto LAB_00251cb3;
}

Assistant:

int CTcTokenizer::parse_macro_actuals(const CTcTokString *srcbuf,
                                      utf8_ptr *src,
                                      const CTcHashEntryPp *entry,
                                      size_t argofs[TOK_MAX_MACRO_ARGS],
                                      size_t arglen[TOK_MAX_MACRO_ARGS],
                                      int read_more, int *found_actuals)
{
    tc_toktyp_t typ;
    CTcToken tok;
    int argc;
    int spliced;
    int i;

    /* presume we're not going to do any line splicing */
    spliced = FALSE;

    /* no arguments parsed yet */
    argc = 0;

    /* get the next token after the macro symbol */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* splice another line if necessary */
    if (typ == TOKT_EOF && read_more)
    {
        /* splice a line */
        typ = actual_splice_next_line(srcbuf, src, &tok);

        /* note the splice */
        spliced = TRUE;
    }

    /* if we didn't find an open paren, there's no actual list after all */
    if (typ != TOKT_LPAR)
    {
        /* tell the caller we didn't find any actuals */
        *found_actuals = FALSE;

        /* if we spliced a line, unsplice it at the current token */
        if (spliced)
            unsplice_line(tok.get_text());

        /* return success */
        return 0;
    }

    /* remember the offset of the start of the first argument */
    argofs[argc] = tok.get_text() + tok.get_text_len() - srcbuf->get_text();

    /* skip the open paren */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* read the arguments */
    while (typ != TOKT_RPAR)
    {
        utf8_ptr p;
        int paren_depth, bracket_depth, brace_depth;
        int sp_cnt;

        /* if we have too many arguments, it's an error */
        if ((argc >= entry->get_argc() && !entry->has_varargs())
            || argc >= TOK_MAX_MACRO_ARGS)
        {
            /* log the error */
            log_error(TCERR_PP_MANY_MACRO_ARGS,
                      (int)entry->getlen(), entry->getstr());

            /* scan ahead to to close paren or end of line */
            while (typ != TOKT_RPAR && typ != TOKT_EOF)
                typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                                   TRUE);
            
            /* done scanning arguments */
            break;
        }
        
        /* 
         *   Skip tokens until we find the end of the argument.  An argument
         *   ends at:
         *   
         *   - a comma outside of nested parens, square brackets, or curly
         *   braces
         *   
         *   - a close paren that doesn't match an open paren found earlier
         *   in the same argument
         */
        paren_depth = bracket_depth = brace_depth = 0;
        for (;;)
        {
            /* 
             *   If it's a comma, and we're not in any sort of nested
             *   brackets (parens, square brackets, or curly braces), the
             *   comma ends the argument.  A comma within any type of
             *   brackets is part of the argument text.
             */
            if (typ == TOKT_COMMA
                && paren_depth == 0 && brace_depth == 0 && bracket_depth == 0)
                break;

            /*
             *   If it's a close paren, and it doesn't match an earlier open
             *   paren in the same argument, it's the end of the argument. 
             */
            if (typ == TOKT_RPAR && paren_depth == 0)
                break;

            /* 
             *   if it's an open or close paren, brace, or bracket, adjust
             *   the depth accordingly 
             */
            switch(typ)
            {
            case TOKT_LPAR:
                ++paren_depth;
                break;

            case TOKT_RPAR:
                --paren_depth;
                break;

            case TOKT_LBRACE:
                ++brace_depth;
                break;

            case TOKT_RBRACE:
                --brace_depth;
                break;

            case TOKT_LBRACK:
                ++bracket_depth;
                break;

            case TOKT_RBRACK:
                --bracket_depth;
                break;

            default:
                break;
            }
            
            /* get the next token */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
            
            /* 
             *   if we're at the end of the line, and we're allowed to
             *   read more, splice the next line onto the current line 
             */
            if (typ == TOKT_EOF && read_more)
            {
                /* splice a line */
                typ = actual_splice_next_line(srcbuf, src, &tok);

                /* note that we've done some line splicing */
                spliced = TRUE;
            }
            
            /* if we've reached the end of the file, stop */
            if (typ == TOKT_EOF)
                break;
        }

        /* if we've reached the end of the file, stop */
        if (typ == TOKT_EOF)
            break;

        /* remove any trailing whitespace from the actual's text */
        sp_cnt = 0;
        p.set((char *)tok.get_text());
        while (p.getptr() > srcbuf->get_text() + argofs[argc])
        {
            wchar_t ch;

            /* move to the prior character */
            p.dec();

            /* if it's not a space, stop looking */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* 
                 *   advance past this character so that we keep it in the
                 *   expansion 
                 */
                p.inc();

                /* 
                 *   if this last character was a backslash, and we removed
                 *   at least one space following it, keep the one space
                 *   that immediately follows the backslash, since that
                 *   space is part of the backslash's two-character escape
                 *   sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* stop scanning */
                break;
            }

            /* that's one more trailing space we've removed - count it */
            ++sp_cnt;
        }

        /* note the argument length */
        arglen[argc] = (p.getptr() - srcbuf->get_text()) - argofs[argc];

        /* count the argument */
        ++argc;
        
        /* check for another argument */
        if (typ == TOKT_COMMA)
        {
            /* remember the offset of the start of this argument */
            argofs[argc] = tok.get_text() + tok.get_text_len()
                           - srcbuf->get_text();

            /* skip the comma and go back for another argument */
            typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_,
                               TRUE);
        }
        else if (typ == TOKT_RPAR)
        {
            /* 
             *   No need to look any further.  Note that we don't want to
             *   get another token, since we're done parsing the input
             *   now, and we want to leave the token stream positioned for
             *   the caller just after the extent of the macro, which, in
             *   the case of this function-like macro, ends with the
             *   closing paren.  
             */
            break;
        }
    }

    /* if we didn't find the right paren, flag the error */
    if (typ != TOKT_RPAR)
    {
        log_error(read_more
                  ? TCERR_PP_MACRO_ARG_RPAR : TCERR_PP_MACRO_ARG_RPAR_1LINE,
                  (int)entry->getlen(), entry->getstr());
        return 1;
    }

    /* remove leading and trailing whitespace from each argument */
    for (i = 0 ; i < argc ; ++i)
    {
        const char *start;
        const char *end;
        utf8_ptr p;
        size_t del_len;
        int sp_cnt;

        /* figure the limits of the argument text */
        start = srcbuf->get_text() + argofs[i];
        end = start + arglen[i];

        /* remove leading whitespace */
        for (p.set((char *)start) ; p.getptr() < end && is_space(p.getch()) ;
             p.inc()) ;

        /* set the new offset and length */
        del_len = p.getptr() - start;
        argofs[i] += del_len;
        arglen[i] -= del_len;
        start += del_len;

        /* remove trailing whitespace */
        p.set((char *)end);
        sp_cnt = 0;
        while (p.getptr() > start)
        {
            wchar_t ch;

            /* go to the prior character */
            p.dec();

            /* if it's not whitespace, keep it */
            ch = p.getch();
            if (!is_space(ch))
            {
                /* put the character back */
                p.inc();

                /* 
                 *   if this is a backslash, and a space follows, keep the
                 *   immediately following space, since it's part of the
                 *   backslash sequence 
                 */
                if (ch == '\\' && sp_cnt != 0)
                    p.inc();

                /* we're done scanning */
                break;
            }

            /* count another removed trailing space */
            ++sp_cnt;
        }

        /* adjust the length */
        arglen[i] -= (end - p.getptr());
    }

    /* 
     *   if we did any line splicing, cut off the rest of the line and
     *   push it back into the logical input stream as a new line - this
     *   will allow better error message positioning if errors occur in
     *   the remainder of the line, since this means we'll only
     *   artificially join onto one line the part of the new line that
     *   contained the macro parameters 
     */
    if (spliced)
        unsplice_line(tok.get_text() + tok.get_text_len());
    
    /* make sure we found enough arguments */
    if (argc < entry->get_min_argc())
    {
        /* fill in the remaining arguments with empty strings */
        for ( ; argc < entry->get_argc() ; ++argc)
        {
            argofs[argc] = 0;
            arglen[argc] = 0;
        }
        
        /* note the error, but proceed with empty arguments */
        log_warning(TCERR_PP_FEW_MACRO_ARGS,
                    (int)entry->getlen(), entry->getstr());
    }

    /* 
     *   if we have varargs, always supply an empty marker for the last
     *   argument 
     */
    if (entry->has_varargs() && argc < TOK_MAX_MACRO_ARGS)
    {
        argofs[argc] = 0;
        arglen[argc] = 0;
    }

    /* success - we found an actual parameter list */
    *found_actuals = TRUE;
    return 0;
}